

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

void __thiscall
bloaty::RangeMap::AddDualRange
          (RangeMap *this,uint64_t addr,uint64_t size,uint64_t otheraddr,string *label)

{
  _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter_00;
  bool bVar1;
  undefined8 uVar2;
  pointer ppVar3;
  unsigned_long *puVar4;
  long in_RCX;
  long in_RDX;
  _Base_ptr in_RSI;
  _Base_ptr in_RDI;
  iterator iter_1;
  uint64_t other;
  uint64_t this_end;
  uint64_t end;
  uint64_t base;
  iterator iter;
  iterator it;
  pair<unsigned_long,_bloaty::RangeMap::Entry> *in_stack_fffffffffffffd98;
  iterator in_stack_fffffffffffffda0;
  const_iterator in_stack_fffffffffffffda8;
  const_iterator __pos;
  Entry *in_stack_fffffffffffffdb0;
  uint64_t in_stack_fffffffffffffdb8;
  _Base_ptr in_stack_fffffffffffffdc0;
  undefined6 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
  in_stack_fffffffffffffdd0;
  const_iterator in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  undefined1 uVar5;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
  in_stack_fffffffffffffdf8;
  RangeMap *in_stack_fffffffffffffe28;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
  in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe60;
  uint64_t in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  RangeMap *in_stack_fffffffffffffe78;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
  in_stack_fffffffffffffe80;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> local_150;
  _Base_ptr local_148;
  long local_140;
  _Self local_138;
  _Base_ptr local_130;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> local_110;
  _Base_ptr local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  string local_f0 [152];
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Self local_38;
  _Self local_30 [2];
  long local_20;
  long local_18;
  _Base_ptr local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (2 < verbose_level) {
    uVar2 = std::__cxx11::string::c_str();
    printf("%p AddDualRange([%lx, %lx], %lx, %s)\n",in_RDI,in_RSI,in_RDX,in_RCX,uVar2);
    in_stack_fffffffffffffdf8._M_node = in_RSI;
  }
  if (local_18 != 0) {
    local_30[0]._M_node =
         (_Base_ptr)
         FindContainingOrAfter
                   ((RangeMap *)
                    CONCAT17(in_stack_fffffffffffffdcf,
                             CONCAT16(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8)),
                    in_stack_fffffffffffffdc0);
    if (local_18 == -1) {
      if (local_20 != -1) {
        __assert_fail("otheraddr == kNoTranslation",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                      ,0xc1,
                      "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                     );
      }
      local_38._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
           ::end((map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                  *)in_stack_fffffffffffffd98);
      bVar1 = std::operator!=(local_30,&local_38);
      uVar5 = false;
      if (bVar1) {
        local_40 = local_30[0]._M_node;
        iter_00._M_node._6_1_ = in_stack_fffffffffffffdce;
        iter_00._M_node._0_6_ = in_stack_fffffffffffffdc8;
        iter_00._M_node._7_1_ = in_stack_fffffffffffffdcf;
        uVar5 = EntryContainsStrict<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                          ((RangeMap *)in_stack_fffffffffffffdc0,iter_00,in_stack_fffffffffffffdb8);
      }
      if ((bool)uVar5 == false) {
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
        _Rb_tree_const_iterator(&local_58,local_30);
        Entry::Entry(in_stack_fffffffffffffdb0,(string *)in_stack_fffffffffffffda8._M_node,
                     (uint64_t)in_stack_fffffffffffffda0._M_node,(uint64_t)in_stack_fffffffffffffd98
                    );
        std::make_pair<unsigned_long&,bloaty::RangeMap::Entry>
                  ((unsigned_long *)in_stack_fffffffffffffda8._M_node,
                   (Entry *)in_stack_fffffffffffffda0._M_node);
        local_50 = (_Base_ptr)
                   std::
                   map<unsigned_long,bloaty::RangeMap::Entry,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                   ::emplace_hint<std::pair<unsigned_long,bloaty::RangeMap::Entry>>
                             (in_stack_fffffffffffffda0._M_node,in_stack_fffffffffffffda8,
                              in_stack_fffffffffffffd98);
        std::pair<unsigned_long,_bloaty::RangeMap::Entry>::~pair
                  ((pair<unsigned_long,_bloaty::RangeMap::Entry> *)0x1c4a1c);
        Entry::~Entry((Entry *)0x1c4a29);
        if (2 < verbose_level) {
          local_f8 = local_50;
          EntryDebugString<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                    ((RangeMap *)CONCAT17(uVar5,in_stack_fffffffffffffdf0),in_stack_fffffffffffffdf8
                    );
          uVar2 = std::__cxx11::string::c_str();
          printf("  added entry: %s\n",uVar2);
          std::__cxx11::string::~string(local_f0);
        }
      }
      else {
        local_48 = local_30[0]._M_node;
        MaybeSetLabel<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                  (in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      }
    }
    else {
      local_100 = local_10;
      local_108 = (_Base_ptr)(&(((Map *)&local_10->_M_color)->_M_t)._M_impl.field_0x0 + local_18);
      if (local_108 < local_10) {
        __assert_fail("end >= addr",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                      ,0xd0,
                      "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                     );
      }
      while( true ) {
        while( true ) {
          uVar5 = false;
          if (local_10 < local_108) {
            std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
            _Rb_tree_const_iterator(&local_110,local_30);
            bVar1 = IterIsEnd((RangeMap *)in_stack_fffffffffffffd98,
                              (const_iterator)in_stack_fffffffffffffda0._M_node);
            uVar5 = false;
            if (!bVar1) {
              local_118 = local_30[0]._M_node;
              uVar5 = EntryContains<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                                ((RangeMap *)
                                 (ulong)CONCAT16(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8
                                                ),in_stack_fffffffffffffdd0,
                                 (uint64_t)in_stack_fffffffffffffdc0);
            }
          }
          if ((bool)uVar5 == false) break;
          if (local_108 < local_10) {
            __assert_fail("end >= addr",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                          ,0xd6,
                          "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                         );
          }
          local_120 = local_30[0]._M_node;
          MaybeSetLabel<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
          _Rb_tree_const_iterator(&local_128,local_30);
          local_10 = (_Base_ptr)
                     RangeEndUnknownLimit
                               (in_stack_fffffffffffffdd0._M_node,in_stack_fffffffffffffdd8,
                                CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffdce,
                                                        in_stack_fffffffffffffdc8)));
          std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
          operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
                     in_stack_fffffffffffffda0._M_node);
        }
        if (local_108 <= local_10) break;
        local_130 = local_108;
        local_138._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
             ::end((map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                    *)in_stack_fffffffffffffd98);
        bVar1 = std::operator!=(local_30,&local_138);
        in_stack_fffffffffffffdce = false;
        if (bVar1) {
          in_stack_fffffffffffffdc0 = local_108;
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                                 *)0x1c4d25);
          in_stack_fffffffffffffdce = (_Base_ptr)ppVar3->first < in_stack_fffffffffffffdc0;
        }
        if ((bool)in_stack_fffffffffffffdce != false) {
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                                 *)0x1c4d4e);
          if ((_Base_ptr)ppVar3->first < local_10) {
            __assert_fail("it->first >= addr",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                          ,0xe4,
                          "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                         );
          }
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                                 *)0x1c4d89);
          puVar4 = std::min<unsigned_long>((unsigned_long *)&local_108,&ppVar3->first);
          local_130 = (_Base_ptr)*puVar4;
        }
        if (local_20 == -1) {
          local_140 = -1;
        }
        else {
          local_140 = (long)local_10 + (local_20 - (long)local_100);
        }
        if (local_130 < local_10) {
          __assert_fail("this_end >= addr",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                        ,0xea,
                        "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                       );
        }
        __pos._M_node = in_RDI;
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
        _Rb_tree_const_iterator(&local_150,local_30);
        Entry::Entry((Entry *)&stack0xfffffffffffffe48,(string *)__pos._M_node,
                     (uint64_t)in_stack_fffffffffffffda0._M_node,(uint64_t)in_stack_fffffffffffffd98
                    );
        std::make_pair<unsigned_long&,bloaty::RangeMap::Entry>
                  ((unsigned_long *)__pos._M_node,(Entry *)in_stack_fffffffffffffda0._M_node);
        in_stack_fffffffffffffda0 =
             std::
             map<unsigned_long,bloaty::RangeMap::Entry,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
             ::emplace_hint<std::pair<unsigned_long,bloaty::RangeMap::Entry>>
                       (in_stack_fffffffffffffda0._M_node,__pos,in_stack_fffffffffffffd98);
        local_148 = in_stack_fffffffffffffda0._M_node;
        std::pair<unsigned_long,_bloaty::RangeMap::Entry>::~pair
                  ((pair<unsigned_long,_bloaty::RangeMap::Entry> *)0x1c4ec5);
        Entry::~Entry((Entry *)0x1c4ed2);
        if (2 < verbose_level) {
          in_stack_fffffffffffffd98 =
               (pair<unsigned_long,_bloaty::RangeMap::Entry> *)&stack0xfffffffffffffe28;
          EntryDebugString<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                    ((RangeMap *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                     in_stack_fffffffffffffdf8);
          uVar2 = std::__cxx11::string::c_str();
          printf("  added entry: %s\n",uVar2);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
        }
        CheckConsistency<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
        local_10 = local_130;
      }
    }
  }
  return;
}

Assistant:

void RangeMap::AddDualRange(uint64_t addr, uint64_t size, uint64_t otheraddr,
                            const std::string& label) {
  if (verbose_level > 2) {
    printf("%p AddDualRange([%" PRIx64 ", %" PRIx64 "], %" PRIx64 ", %s)\n",
           this, addr, size, otheraddr, label.c_str());
  }

  if (size == 0) return;

  auto it = FindContainingOrAfter(addr);

  if (size == kUnknownSize) {
    assert(otheraddr == kNoTranslation);
    if (it != mappings_.end() && EntryContainsStrict(it, addr)) {
      MaybeSetLabel(it, label, addr, kUnknownSize);
    } else {
      auto iter = mappings_.emplace_hint(
          it, std::make_pair(addr, Entry(label, kUnknownSize, kNoTranslation)));
      if (verbose_level > 2) {
        printf("  added entry: %s\n", EntryDebugString(iter).c_str());
      }
    }
    return;
  }

  const uint64_t base = addr;
  uint64_t end = addr + size;
  assert(end >= addr);

  while (1) {
    // Advance past existing entries that intersect this range until we find a
    // gap.
    while (addr < end && !IterIsEnd(it) && EntryContains(it, addr)) {
      assert(end >= addr);
      MaybeSetLabel(it, label, addr, end - addr);
      addr = RangeEndUnknownLimit(it, addr);
      ++it;
    }

    if (addr >= end) {
      return;
    }

    // We found a gap and need to create an entry.  Need to make sure the new
    // entry doesn't extend into a range that was previously defined.
    uint64_t this_end = end;
    if (it != mappings_.end() && end > it->first) {
      assert(it->first >= addr);
      this_end = std::min(end, it->first);
    }

    uint64_t other = (otheraddr == kNoTranslation) ? kNoTranslation
                                                   : addr - base + otheraddr;
    assert(this_end >= addr);
    auto iter = mappings_.emplace_hint(
        it, std::make_pair(addr, Entry(label, this_end - addr, other)));
    if (verbose_level > 2) {
      printf("  added entry: %s\n", EntryDebugString(iter).c_str());
    }
    CheckConsistency(iter);
    addr = this_end;
  }
}